

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_tet_dquality_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  REF_DBL det;
  REF_DBL temp;
  REF_DBL l5;
  REF_DBL l1;
  REF_DBL l0;
  REF_DBL volume;
  REF_DBL l4;
  REF_DBL l3;
  REF_DBL l2;
  REF_DBL volume_1;
  REF_DBL det_1;
  REF_DBL d_denom [3];
  REF_DBL d_num [3];
  REF_DBL jac [9];
  REF_DBL d_volume [3];
  REF_DBL d_volume_in_metric [3];
  REF_DBL d_l2 [3];
  REF_DBL d_l1 [3];
  REF_DBL d_l0 [3];
  double local_3f8;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  REF_DBL local_330;
  REF_DBL local_328;
  REF_DBL RStack_320;
  REF_DBL local_318;
  double local_308 [4];
  double local_2e8 [4];
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2a8 [4];
  double local_288 [4];
  double local_268 [4];
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_1f8 [4];
  double local_1d8 [4];
  double local_1b8;
  double local_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  REF_DBL local_178 [10];
  REF_DBL local_128 [6];
  REF_DBL local_f8 [6];
  REF_DBL local_c8 [6];
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  if (ref_node->tet_quality == 2) {
    uVar6 = ref_node_tet_dvol_dnode0(ref_node,nodes,&local_228,&local_328);
    uVar10 = (ulong)uVar6;
    if (uVar6 == 0) {
      if (local_228 <= ref_node->min_volume) {
        *quality = local_228 - ref_node->min_volume;
        d_quality[2] = local_318;
        *d_quality = local_328;
        d_quality[1] = RStack_320;
LAB_00125f88:
        uVar10 = 0;
      }
      else {
        iVar1 = *nodes;
        pRVar5 = ref_node->real;
        lVar7 = 0;
        do {
          local_68[lVar7] = pRVar5[iVar1 * 0xf + 9 + (int)lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 6);
        iVar1 = nodes[1];
        lVar7 = 0;
        do {
          local_98[lVar7] = pRVar5[iVar1 * 0xf + 9 + (int)lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 6);
        iVar1 = nodes[2];
        lVar7 = 0;
        do {
          local_c8[lVar7] = pRVar5[iVar1 * 0xf + 9 + (int)lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 6);
        iVar1 = nodes[3];
        lVar7 = 0;
        do {
          local_128[lVar7] = pRVar5[iVar1 * 0xf + 9 + (int)lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 6);
        lVar7 = 0;
        do {
          local_f8[lVar7] =
               (local_68[lVar7] + local_98[lVar7] + local_c8[lVar7] + local_128[lVar7]) * 0.25;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 6);
        uVar6 = ref_matrix_exp_m(local_f8,local_1d8);
        if (uVar6 == 0) {
          uVar6 = ref_matrix_jacob_m(local_1d8,local_178);
          if (uVar6 == 0) {
            pRVar5 = ref_node->real;
            iVar1 = nodes[1];
            iVar2 = *nodes;
            lVar7 = 0;
            do {
              local_1f8[lVar7] =
                   pRVar5[(long)iVar1 * 0xf + lVar7] - pRVar5[(long)iVar2 * 0xf + lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            iVar3 = nodes[2];
            lVar7 = 0;
            do {
              local_2e8[lVar7] =
                   pRVar5[(long)iVar3 * 0xf + lVar7] - pRVar5[(long)iVar2 * 0xf + lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            iVar4 = nodes[3];
            lVar7 = 0;
            do {
              local_308[lVar7] =
                   pRVar5[(long)iVar4 * 0xf + lVar7] - pRVar5[(long)iVar2 * 0xf + lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            lVar7 = 0;
            do {
              local_268[lVar7] =
                   pRVar5[(long)iVar3 * 0xf + lVar7] - pRVar5[(long)iVar1 * 0xf + lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            lVar7 = 0;
            do {
              local_288[lVar7] =
                   pRVar5[(long)iVar4 * 0xf + lVar7] - pRVar5[(long)iVar1 * 0xf + lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            lVar7 = 0;
            do {
              local_2a8[lVar7] =
                   pRVar5[(long)iVar4 * 0xf + lVar7] - pRVar5[(long)iVar3 * 0xf + lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            local_248 = local_1d8[1];
            local_360 = local_1f8[0];
            local_370 = local_1f8[1];
            local_230 = local_1d8[2];
            local_3b8 = local_1f8[2];
            local_380 = local_1b0;
            local_368 = local_2e8[0];
            local_378 = local_2e8[1];
            local_358 = local_2e8[2];
            local_348 = local_308[0];
            local_350 = local_308[1];
            local_3b0 = local_308[2];
            local_3a0 = local_268[0];
            local_3a8 = local_268[1];
            local_398 = local_268[2];
            local_388 = local_288[0];
            local_390 = local_288[1];
            local_340 = local_288[2];
            local_338 = local_2a8[0];
            local_240 = local_2a8[1];
            local_238 = local_2a8[2];
            uVar6 = ref_matrix_vt_m_v_deriv(local_1d8,local_1f8,&local_330,&local_3e8);
            if (uVar6 == 0) {
              uVar6 = ref_matrix_vt_m_v_deriv(local_1d8,local_2e8,&local_330,&local_2c8);
              if (uVar6 == 0) {
                uVar6 = ref_matrix_vt_m_v_deriv(local_1d8,local_308,&local_330,&local_218);
                if (uVar6 == 0) {
                  local_1a8 = (-local_3e8 - local_2c8) - local_218;
                  uStack_1a0 = 0x8000000000000000;
                  local_198 = (-local_3e0 - local_2c0) - local_210;
                  uStack_190 = 0x8000000000000000;
                  local_188 = (-local_3d8 - local_2b8) - local_208;
                  uStack_180 = 0x8000000000000000;
                  uVar6 = ref_matrix_det_m(local_1d8,&local_220);
                  if (uVar6 == 0) {
                    local_3c8 = (local_230 * local_3b8 +
                                local_1d8[0] * local_360 + local_248 * local_370) * local_360 +
                                (local_1b8 * local_3b8 +
                                local_248 * local_360 + local_370 * local_1d8[3]) * local_370;
                    local_3c0 = (local_230 * local_3b0 +
                                local_1d8[0] * local_348 + local_248 * local_350) * local_348 +
                                (local_1b8 * local_3b0 +
                                local_248 * local_348 + local_1d8[3] * local_350) * local_350;
                    local_380 = (local_380 * local_238 +
                                local_230 * local_338 + local_1b8 * local_240) * local_238 +
                                (local_230 * local_238 +
                                local_1d8[0] * local_338 + local_248 * local_240) * local_338 +
                                (local_1b8 * local_238 +
                                local_248 * local_338 + local_1d8[3] * local_240) * local_240 +
                                (local_380 * local_340 +
                                local_230 * local_388 + local_1b8 * local_390) * local_340 +
                                (local_230 * local_340 +
                                local_1d8[0] * local_388 + local_248 * local_390) * local_388 +
                                (local_1b8 * local_340 +
                                local_248 * local_388 + local_1d8[3] * local_390) * local_390 +
                                (local_380 * local_398 +
                                local_230 * local_3a0 + local_1b8 * local_3a8) * local_398 +
                                (local_230 * local_398 +
                                local_1d8[0] * local_3a0 + local_248 * local_3a8) * local_3a0 +
                                (local_1b8 * local_398 +
                                local_248 * local_3a0 + local_1d8[3] * local_3a8) * local_3a8 +
                                (local_380 * local_3b0 +
                                local_230 * local_348 + local_1b8 * local_350) * local_3b0 +
                                local_3c0 +
                                (local_380 * local_358 +
                                local_230 * local_368 + local_1b8 * local_378) * local_358 +
                                (local_230 * local_358 +
                                local_1d8[0] * local_368 + local_248 * local_378) * local_368 +
                                (local_1b8 * local_358 +
                                local_248 * local_368 + local_1d8[3] * local_378) * local_378 +
                                (local_380 * local_3b8 +
                                local_230 * local_360 + local_370 * local_1b8) * local_3b8 +
                                local_3c8;
                    if (local_220 < 0.0) {
                      local_220 = sqrt(local_220);
                    }
                    else {
                      local_220 = SQRT(local_220);
                    }
                    dVar11 = pow(local_228 * local_220,0.6666666666666666);
                    dVar13 = pow(local_228 * local_220,-0.3333333333333333);
                    dVar12 = local_380 * 1e+20;
                    if (dVar12 <= -dVar12) {
                      dVar12 = -dVar12;
                    }
                    dVar14 = -dVar11;
                    dVar15 = dVar11;
                    if (dVar11 <= dVar14) {
                      dVar15 = dVar14;
                    }
                    if (dVar12 <= dVar15) {
                      *quality = -1.0;
                      *d_quality = 0.0;
                      d_quality[1] = 0.0;
                      d_quality[2] = 0.0;
                    }
                    else {
                      local_220 = local_220 * dVar13 * 0.6666666666666666;
                      *quality = (dVar11 * 24.9610058766228) / local_380;
                      dVar12 = local_380 * local_380;
                      *d_quality = ((local_220 * local_328 * local_380 + local_1a8 * dVar14) *
                                   24.9610058766228) / dVar12;
                      d_quality[1] = ((RStack_320 * local_220 * local_380 + local_198 * dVar14) *
                                     24.9610058766228) / dVar12;
                      d_quality[2] = ((local_318 * local_220 * local_380 + local_188 * dVar14) *
                                     24.9610058766228) / dVar12;
                    }
                    goto LAB_00125f88;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x729,"ref_node_tet_jac_dquality_dnode0",(ulong)uVar6,"det(mavg)");
                  uVar10 = (ulong)uVar6;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x724,"ref_node_tet_jac_dquality_dnode0",(ulong)uVar6,"d_e2");
                  uVar10 = (ulong)uVar6;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x723,"ref_node_tet_jac_dquality_dnode0",(ulong)uVar6,"d_e1");
                uVar10 = (ulong)uVar6;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x722,"ref_node_tet_jac_dquality_dnode0",(ulong)uVar6,"d_e0");
              uVar10 = (ulong)uVar6;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x709,"ref_node_tet_jac_dquality_dnode0",(ulong)uVar6,"jac");
            uVar10 = (ulong)uVar6;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x708,"ref_node_tet_jac_dquality_dnode0",(ulong)uVar6,"exp");
          uVar10 = (ulong)uVar6;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x6fb,
             "ref_node_tet_jac_dquality_dnode0",uVar10,"vol");
    }
    if ((int)uVar10 == 0) {
      return 0;
    }
    pcVar9 = "jac";
    uVar8 = 0x755;
    goto LAB_00125ffe;
  }
  if (ref_node->tet_quality != 1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x758,
           "ref_node_tet_dquality_dnode0","case not recognized");
    return 1;
  }
  uVar6 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[1],local_2e8,local_68);
  uVar10 = (ulong)uVar6;
  if (uVar6 == 0) {
    uVar6 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[2],local_308,local_98);
    if (uVar6 == 0) {
      uVar6 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[3],local_268,local_c8);
      if (uVar6 == 0) {
        uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[2],local_288);
        if (uVar6 == 0) {
          uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[3],local_2a8);
          if (uVar6 == 0) {
            uVar6 = ref_node_ratio(ref_node,nodes[2],nodes[3],&local_328);
            if (uVar6 == 0) {
              uVar6 = ref_node_tet_dvol_dnode0(ref_node,nodes,&local_2c8,local_128);
              if (uVar6 == 0) {
                if (local_2c8 <= ref_node->min_volume) {
                  *quality = local_2c8 - ref_node->min_volume;
                  d_quality[2] = local_128[2];
                  *d_quality = local_128[0];
                  d_quality[1] = local_128[1];
LAB_00125fd5:
                  uVar10 = 0;
                }
                else {
                  iVar1 = *nodes;
                  pRVar5 = ref_node->real;
                  lVar7 = 0;
                  do {
                    local_178[lVar7] = pRVar5[iVar1 * 0xf + 3 + (int)lVar7];
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 6);
                  uVar6 = ref_matrix_det_m(local_178,&local_3e8);
                  dVar12 = local_3e8;
                  if (uVar6 == 0) {
                    iVar1 = nodes[1];
                    pRVar5 = ref_node->real;
                    lVar7 = 0;
                    do {
                      local_178[lVar7] = pRVar5[iVar1 * 0xf + 3 + (int)lVar7];
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 6);
                    uVar6 = ref_matrix_det_m(local_178,&local_3e8);
                    dVar11 = local_3e8;
                    if (uVar6 == 0) {
                      iVar1 = nodes[2];
                      pRVar5 = ref_node->real;
                      lVar7 = 0;
                      do {
                        local_178[lVar7] = pRVar5[iVar1 * 0xf + 3 + (int)lVar7];
                        lVar7 = lVar7 + 1;
                      } while (lVar7 != 6);
                      uVar6 = ref_matrix_det_m(local_178,&local_3e8);
                      dVar13 = local_3e8;
                      if (uVar6 == 0) {
                        if (dVar11 <= dVar12) {
                          dVar12 = dVar11;
                        }
                        iVar1 = nodes[3];
                        pRVar5 = ref_node->real;
                        lVar7 = 0;
                        do {
                          local_178[lVar7] = pRVar5[iVar1 * 0xf + 3 + (int)lVar7];
                          lVar7 = lVar7 + 1;
                        } while (lVar7 != 6);
                        uVar6 = ref_matrix_det_m(local_178,&local_3e8);
                        if (uVar6 == 0) {
                          if (dVar13 <= dVar12) {
                            dVar12 = dVar13;
                          }
                          if (local_3e8 <= dVar12) {
                            dVar12 = local_3e8;
                          }
                          local_3f8 = SQRT(dVar12);
                          if (dVar12 < 0.0) {
                            local_3f8 = sqrt(dVar12);
                          }
                          lVar7 = 0;
                          do {
                            dVar11 = SQRT(dVar12);
                            if (dVar12 < 0.0) {
                              dVar11 = sqrt(dVar12);
                            }
                            local_f8[lVar7] = dVar11 * local_128[lVar7];
                            lVar7 = lVar7 + 1;
                          } while (lVar7 != 3);
                          dVar12 = pow(local_2c8 * local_3f8,0.6666666666666666);
                          lVar7 = 0;
                          do {
                            dVar11 = pow(local_2c8 * local_3f8,-0.3333333333333333);
                            local_1d8[lVar7] = dVar11 * 0.6666666666666666 * local_f8[lVar7];
                            lVar7 = lVar7 + 1;
                          } while (lVar7 != 3);
                          lVar7 = 0;
                          do {
                            local_1f8[lVar7] =
                                 local_c8[lVar7] * (local_268[0] + local_268[0]) +
                                 local_68[lVar7] * (local_2e8[0] + local_2e8[0]) +
                                 local_98[lVar7] * (local_308[0] + local_308[0]);
                            lVar7 = lVar7 + 1;
                          } while (lVar7 != 3);
                          dVar13 = local_328 * local_328 +
                                   local_2a8[0] * local_2a8[0] +
                                   local_288[0] * local_288[0] +
                                   local_268[0] * local_268[0] +
                                   local_2e8[0] * local_2e8[0] + local_308[0] * local_308[0];
                          dVar11 = dVar13 * 1e+20;
                          if (dVar11 <= -dVar11) {
                            dVar11 = -dVar11;
                          }
                          dVar14 = -dVar12;
                          dVar15 = dVar12;
                          if (dVar12 <= dVar14) {
                            dVar15 = dVar14;
                          }
                          if (dVar11 <= dVar15) {
                            *quality = -1.0;
                            *d_quality = 0.0;
                            d_quality[1] = 0.0;
                            d_quality[2] = 0.0;
                            goto LAB_00125fd5;
                          }
                          *quality = (dVar12 * 24.9610058766228) / dVar13;
                          uVar10 = 0;
                          lVar7 = 0;
                          do {
                            d_quality[lVar7] =
                                 (((local_1d8[lVar7] * dVar13 + local_1f8[lVar7] * dVar14) *
                                  24.9610058766228) / dVar13) / dVar13;
                            lVar7 = lVar7 + 1;
                          } while (lVar7 != 3);
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                 ,0x6cf,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"n3");
                          uVar10 = (ulong)uVar6;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                               ,0x6cb,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"n2");
                        uVar10 = (ulong)uVar6;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x6c7,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"n1");
                      uVar10 = (ulong)uVar6;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x6c3,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"n0");
                    uVar10 = (ulong)uVar6;
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x6ba,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"vol");
                uVar10 = (ulong)uVar6;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x6b8,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"l5");
              uVar10 = (ulong)uVar6;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x6b7,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"l4");
            uVar10 = (ulong)uVar6;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x6b6,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"l3");
          uVar10 = (ulong)uVar6;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x6b5,"ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"l2");
        uVar10 = (ulong)uVar6;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x6b4,
             "ref_node_tet_epic_dquality_dnode0",(ulong)uVar6,"l1");
      uVar10 = (ulong)uVar6;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x6b3,
           "ref_node_tet_epic_dquality_dnode0",uVar10,"l0");
  }
  if ((int)uVar10 == 0) {
    return 0;
  }
  pcVar9 = "epic";
  uVar8 = 0x751;
LAB_00125ffe:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
         "ref_node_tet_dquality_dnode0",uVar10,pcVar9);
  return (REF_STATUS)uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_dquality_dnode0(REF_NODE ref_node,
                                                REF_INT *nodes,
                                                REF_DBL *quality,
                                                REF_DBL *d_quality) {
  switch (ref_node->tet_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tet_epic_dquality_dnode0(ref_node, nodes, quality,
                                            d_quality),
          "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tet_jac_dquality_dnode0(ref_node, nodes, quality, d_quality),
          "jac");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}